

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowDemoWindowPopups(void)

{
  char *pcVar1;
  bool bVar2;
  ImGuiViewport *this;
  char *local_188;
  ImVec2 local_17c;
  ImVec2 local_174;
  bool local_169;
  bool unused_open;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 center;
  ImVec2 local_128;
  ImVec2 local_120;
  char local_118 [8];
  char buf [64];
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImVec2 local_bc;
  ImVec2 local_b4;
  int local_ac;
  int n;
  char *names_1 [5];
  ImVec2 local_74;
  ImVec2 local_6c;
  int local_64;
  int i_2;
  int local_58;
  int i_1;
  ImVec2 local_4c;
  int local_44;
  int i;
  undefined8 local_38;
  char *names [5];
  
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
               ,0xccb,"Popups",GImGuiDemoMarkerCallbackUserData);
  }
  bVar2 = ImGui::CollapsingHeader("Popups & Modal windows",0);
  if (bVar2) {
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
                 ,0xce1,"Popups/Popups",GImGuiDemoMarkerCallbackUserData);
    }
    bVar2 = ImGui::TreeNode("Popups");
    if (bVar2) {
      ImGui::TextWrapped(
                        "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                        );
      memcpy(&local_38,&PTR_anon_var_dwarf_b360c_002616c0,0x28);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,0.0,0.0);
      bVar2 = ImGui::Button("Select..",(ImVec2 *)&stack0xffffffffffffffc0);
      if (bVar2) {
        ImGui::OpenPopup("my_select_popup",0);
      }
      ImGui::SameLine(0.0,-1.0);
      if (ShowDemoWindowPopups::selected_fish == -1) {
        local_188 = "<None>";
      }
      else {
        local_188 = names[(long)ShowDemoWindowPopups::selected_fish + -1];
      }
      ImGui::TextUnformatted(local_188,(char *)0x0);
      bVar2 = ImGui::BeginPopup("my_select_popup",0);
      if (bVar2) {
        ImGui::Text("Aquarium");
        ImGui::Separator();
        for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
          pcVar1 = names[(long)local_44 + -1];
          ImVec2::ImVec2(&local_4c,0.0,0.0);
          bVar2 = ImGui::Selectable(pcVar1,false,0,&local_4c);
          if (bVar2) {
            ShowDemoWindowPopups::selected_fish = local_44;
          }
        }
        ImGui::EndPopup();
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffac,0.0,0.0);
      bVar2 = ImGui::Button("Toggle..",(ImVec2 *)&stack0xffffffffffffffac);
      if (bVar2) {
        ImGui::OpenPopup("my_toggle_popup",0);
      }
      bVar2 = ImGui::BeginPopup("my_toggle_popup",0);
      if (bVar2) {
        for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
          ImGui::MenuItem(names[(long)local_58 + -1],"",ShowDemoWindowPopups::toggles + local_58,
                          true);
        }
        bVar2 = ImGui::BeginMenu("Sub-menu",true);
        if (bVar2) {
          ImGui::MenuItem("Click me",(char *)0x0,false,true);
          ImGui::EndMenu();
        }
        ImGui::Separator();
        ImGui::Text("Tooltip here");
        bVar2 = ImGui::IsItemHovered(0);
        if (bVar2) {
          ImGui::SetTooltip("I am a tooltip over a popup");
        }
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,0.0,0.0);
        bVar2 = ImGui::Button("Stacked Popup",(ImVec2 *)&stack0xffffffffffffffa0);
        if (bVar2) {
          ImGui::OpenPopup("another popup",0);
        }
        bVar2 = ImGui::BeginPopup("another popup",0);
        if (bVar2) {
          for (local_64 = 0; local_64 < 5; local_64 = local_64 + 1) {
            ImGui::MenuItem(names[(long)local_64 + -1],"",ShowDemoWindowPopups::toggles + local_64,
                            true);
          }
          bVar2 = ImGui::BeginMenu("Sub-menu",true);
          if (bVar2) {
            ImGui::MenuItem("Click me",(char *)0x0,false,true);
            ImVec2::ImVec2(&local_6c,0.0,0.0);
            bVar2 = ImGui::Button("Stacked Popup",&local_6c);
            if (bVar2) {
              ImGui::OpenPopup("another popup",0);
            }
            bVar2 = ImGui::BeginPopup("another popup",0);
            if (bVar2) {
              ImGui::Text("I am the last one here.");
              ImGui::EndPopup();
            }
            ImGui::EndMenu();
          }
          ImGui::EndPopup();
        }
        ImGui::EndPopup();
      }
      ImVec2::ImVec2(&local_74,0.0,0.0);
      bVar2 = ImGui::Button("With a menu..",&local_74);
      if (bVar2) {
        ImGui::OpenPopup("my_file_popup",0);
      }
      bVar2 = ImGui::BeginPopup("my_file_popup",0x400);
      if (bVar2) {
        bVar2 = ImGui::BeginMenuBar();
        if (bVar2) {
          bVar2 = ImGui::BeginMenu("File",true);
          if (bVar2) {
            ShowExampleMenuFile();
            ImGui::EndMenu();
          }
          bVar2 = ImGui::BeginMenu("Edit",true);
          if (bVar2) {
            ImGui::MenuItem("Dummy",(char *)0x0,false,true);
            ImGui::EndMenu();
          }
          ImGui::EndMenuBar();
        }
        ImGui::Text("Hello from popup!");
        ImVec2::ImVec2((ImVec2 *)((long)names_1 + 0x24),0.0,0.0);
        ImGui::Button("This is a dummy button..",(ImVec2 *)((long)names_1 + 0x24));
        ImGui::EndPopup();
      }
      ImGui::TreePop();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
                 ,0xd40,"Popups/Context menus",GImGuiDemoMarkerCallbackUserData);
    }
    bVar2 = ImGui::TreeNode("Context menus");
    if (bVar2) {
      HelpMarker(
                "\"Context\" functions are simple helpers to associate a Popup to a given Item or Window identifier."
                );
      memcpy(&stack0xffffffffffffff58,&PTR_anon_var_dwarf_b375c_002616f0,0x28);
      for (local_ac = 0; local_ac < 5; local_ac = local_ac + 1) {
        pcVar1 = *(char **)(&stack0xffffffffffffff58 + (long)local_ac * 8);
        ImVec2::ImVec2(&local_b4,0.0,0.0);
        ImGui::Selectable(pcVar1,false,0,&local_b4);
        bVar2 = ImGui::BeginPopupContextItem((char *)0x0,1);
        if (bVar2) {
          ImGui::Text("This a popup for \"%s\"!",
                      *(undefined8 *)(&stack0xffffffffffffff58 + (long)local_ac * 8));
          ImVec2::ImVec2(&local_bc,0.0,0.0);
          bVar2 = ImGui::Button("Close",&local_bc);
          if (bVar2) {
            ImGui::CloseCurrentPopup();
          }
          ImGui::EndPopup();
        }
        bVar2 = ImGui::IsItemHovered(0);
        if (bVar2) {
          ImGui::SetTooltip("Right-click to open popup");
        }
      }
      HelpMarker("Text() elements don\'t have stable identifiers so we need to provide one.");
      ImGui::Text("Value = %.3f <-- (1) right-click this text",(double)ShowDemoWindowPopups::value);
      bVar2 = ImGui::BeginPopupContextItem("my popup",1);
      if (bVar2) {
        ImVec2::ImVec2(&local_c4,0.0,0.0);
        bVar2 = ImGui::Selectable("Set to zero",false,0,&local_c4);
        if (bVar2) {
          ShowDemoWindowPopups::value = 0.0;
        }
        ImVec2::ImVec2(&local_cc,0.0,0.0);
        bVar2 = ImGui::Selectable("Set to PI",false,0,&local_cc);
        if (bVar2) {
          ShowDemoWindowPopups::value = 3.1415;
        }
        ImGui::SetNextItemWidth(-1.1754944e-38);
        ImGui::DragFloat("##Value",&ShowDemoWindowPopups::value,0.1,0.0,0.0,"%.3f",0);
        ImGui::EndPopup();
      }
      ImGui::Text("(2) Or right-click this text");
      ImGui::OpenPopupOnItemClick("my popup",1);
      ImVec2::ImVec2((ImVec2 *)(buf + 0x3c),0.0,0.0);
      bVar2 = ImGui::Button("(3) Or click this button",(ImVec2 *)(buf + 0x3c));
      if (bVar2) {
        ImGui::OpenPopup("my popup",0);
      }
      HelpMarker(
                "Showcase using a popup ID linked to item ID, with the item having a changing label + stable ID using the ### operator."
                );
      sprintf(local_118,"Button: %s###Button",ShowDemoWindowPopups::name);
      ImVec2::ImVec2(&local_120,0.0,0.0);
      ImGui::Button(local_118,&local_120);
      bVar2 = ImGui::BeginPopupContextItem((char *)0x0,1);
      if (bVar2) {
        ImGui::Text("Edit name:");
        ImGui::InputText("##edit",ShowDemoWindowPopups::name,0x20,0,(ImGuiInputTextCallback)0x0,
                         (void *)0x0);
        ImVec2::ImVec2(&local_128,0.0,0.0);
        bVar2 = ImGui::Button("Close",&local_128);
        if (bVar2) {
          ImGui::CloseCurrentPopup();
        }
        ImGui::EndPopup();
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("(<-- right-click here)");
      ImGui::TreePop();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
                 ,0xd95,"Popups/Modals",GImGuiDemoMarkerCallbackUserData);
    }
    bVar2 = ImGui::TreeNode("Modals");
    if (bVar2) {
      ImGui::TextWrapped(
                        "Modal windows are like popups but the user cannot close them by clicking outside."
                        );
      ImVec2::ImVec2(&center,0.0,0.0);
      bVar2 = ImGui::Button("Delete..",&center);
      if (bVar2) {
        ImGui::OpenPopup("Delete?",0);
      }
      this = ImGui::GetMainViewport();
      local_138 = ImGuiViewport::GetCenter(this);
      ImVec2::ImVec2(&local_140,0.5,0.5);
      ImGui::SetNextWindowPos(&local_138,8,&local_140);
      bVar2 = ImGui::BeginPopupModal("Delete?",(bool *)0x0,0x40);
      if (bVar2) {
        ImGui::Text(
                   "All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n"
                   );
        ImGui::Separator();
        ImVec2::ImVec2(&local_148,0.0,0.0);
        ImGui::PushStyleVar(0xb,&local_148);
        ImGui::Checkbox("Don\'t ask me next time",&ShowDemoWindowPopups::dont_ask_me_next_time);
        ImGui::PopStyleVar(1);
        ImVec2::ImVec2(&local_150,120.0,0.0);
        bVar2 = ImGui::Button("OK",&local_150);
        if (bVar2) {
          ImGui::CloseCurrentPopup();
        }
        ImGui::SetItemDefaultFocus();
        ImGui::SameLine(0.0,-1.0);
        ImVec2::ImVec2(&local_158,120.0,0.0);
        bVar2 = ImGui::Button("Cancel",&local_158);
        if (bVar2) {
          ImGui::CloseCurrentPopup();
        }
        ImGui::EndPopup();
      }
      ImVec2::ImVec2(&local_160,0.0,0.0);
      bVar2 = ImGui::Button("Stacked modals..",&local_160);
      if (bVar2) {
        ImGui::OpenPopup("Stacked 1",0);
      }
      bVar2 = ImGui::BeginPopupModal("Stacked 1",(bool *)0x0,0x400);
      if (bVar2) {
        bVar2 = ImGui::BeginMenuBar();
        if (bVar2) {
          bVar2 = ImGui::BeginMenu("File",true);
          if (bVar2) {
            ImGui::MenuItem("Some menu item",(char *)0x0,false,true);
            ImGui::EndMenu();
          }
          ImGui::EndMenuBar();
        }
        ImGui::Text(
                   "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
                   );
        ImGui::Combo("Combo",&ShowDemoWindowPopups::item,"aaaa",-1);
        ImGui::ColorEdit4("color",ShowDemoWindowPopups::color,0);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe98,0.0,0.0);
        bVar2 = ImGui::Button("Add another modal..",(ImVec2 *)&stack0xfffffffffffffe98);
        if (bVar2) {
          ImGui::OpenPopup("Stacked 2",0);
        }
        local_169 = true;
        bVar2 = ImGui::BeginPopupModal("Stacked 2",&local_169,0);
        if (bVar2) {
          ImGui::Text("Hello from Stacked The Second!");
          ImVec2::ImVec2(&local_174,0.0,0.0);
          bVar2 = ImGui::Button("Close",&local_174);
          if (bVar2) {
            ImGui::CloseCurrentPopup();
          }
          ImGui::EndPopup();
        }
        ImVec2::ImVec2(&local_17c,0.0,0.0);
        bVar2 = ImGui::Button("Close",&local_17c);
        if (bVar2) {
          ImGui::CloseCurrentPopup();
        }
        ImGui::EndPopup();
      }
      ImGui::TreePop();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
                 ,0xde1,"Popups/Menus inside a regular window",GImGuiDemoMarkerCallbackUserData);
    }
    bVar2 = ImGui::TreeNode("Menus inside a regular window");
    if (bVar2) {
      ImGui::TextWrapped(
                        "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                        );
      ImGui::Separator();
      ImGui::MenuItem("Menu item","CTRL+M",false,true);
      bVar2 = ImGui::BeginMenu("Menu inside a regular window",true);
      if (bVar2) {
        ShowExampleMenuFile();
        ImGui::EndMenu();
      }
      ImGui::Separator();
      ImGui::TreePop();
    }
  }
  return;
}

Assistant:

static void ShowDemoWindowPopups()
{
    IMGUI_DEMO_MARKER("Popups");
    if (!ImGui::CollapsingHeader("Popups & Modal windows"))
        return;

    // The properties of popups windows are:
    // - They block normal mouse hovering detection outside them. (*)
    // - Unless modal, they can be closed by clicking anywhere outside them, or by pressing ESCAPE.
    // - Their visibility state (~bool) is held internally by Dear ImGui instead of being held by the programmer as
    //   we are used to with regular Begin() calls. User can manipulate the visibility state by calling OpenPopup().
    // (*) One can use IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup) to bypass it and detect hovering even
    //     when normally blocked by a popup.
    // Those three properties are connected. The library needs to hold their visibility state BECAUSE it can close
    // popups at any time.

    // Typical use for regular windows:
    //   bool my_tool_is_active = false; if (ImGui::Button("Open")) my_tool_is_active = true; [...] if (my_tool_is_active) Begin("My Tool", &my_tool_is_active) { [...] } End();
    // Typical use for popups:
    //   if (ImGui::Button("Open")) ImGui::OpenPopup("MyPopup"); if (ImGui::BeginPopup("MyPopup") { [...] EndPopup(); }

    // With popups we have to go through a library call (here OpenPopup) to manipulate the visibility state.
    // This may be a bit confusing at first but it should quickly make sense. Follow on the examples below.

    IMGUI_DEMO_MARKER("Popups/Popups");
    if (ImGui::TreeNode("Popups"))
    {
        ImGui::TextWrapped(
            "When a popup is active, it inhibits interacting with windows that are behind the popup. "
            "Clicking outside the popup closes it.");

        static int selected_fish = -1;
        const char* names[] = { "Bream", "Haddock", "Mackerel", "Pollock", "Tilefish" };
        static bool toggles[] = { true, false, false, false, false };

        // Simple selection popup (if you want to show the current selection inside the Button itself,
        // you may want to build a string using the "###" operator to preserve a constant ID with a variable label)
        if (ImGui::Button("Select.."))
            ImGui::OpenPopup("my_select_popup");
        ImGui::SameLine();
        ImGui::TextUnformatted(selected_fish == -1 ? "<None>" : names[selected_fish]);
        if (ImGui::BeginPopup("my_select_popup"))
        {
            ImGui::Text("Aquarium");
            ImGui::Separator();
            for (int i = 0; i < IM_ARRAYSIZE(names); i++)
                if (ImGui::Selectable(names[i]))
                    selected_fish = i;
            ImGui::EndPopup();
        }

        // Showing a menu with toggles
        if (ImGui::Button("Toggle.."))
            ImGui::OpenPopup("my_toggle_popup");
        if (ImGui::BeginPopup("my_toggle_popup"))
        {
            for (int i = 0; i < IM_ARRAYSIZE(names); i++)
                ImGui::MenuItem(names[i], "", &toggles[i]);
            if (ImGui::BeginMenu("Sub-menu"))
            {
                ImGui::MenuItem("Click me");
                ImGui::EndMenu();
            }

            ImGui::Separator();
            ImGui::Text("Tooltip here");
            if (ImGui::IsItemHovered())
                ImGui::SetTooltip("I am a tooltip over a popup");

            if (ImGui::Button("Stacked Popup"))
                ImGui::OpenPopup("another popup");
            if (ImGui::BeginPopup("another popup"))
            {
                for (int i = 0; i < IM_ARRAYSIZE(names); i++)
                    ImGui::MenuItem(names[i], "", &toggles[i]);
                if (ImGui::BeginMenu("Sub-menu"))
                {
                    ImGui::MenuItem("Click me");
                    if (ImGui::Button("Stacked Popup"))
                        ImGui::OpenPopup("another popup");
                    if (ImGui::BeginPopup("another popup"))
                    {
                        ImGui::Text("I am the last one here.");
                        ImGui::EndPopup();
                    }
                    ImGui::EndMenu();
                }
                ImGui::EndPopup();
            }
            ImGui::EndPopup();
        }

        // Call the more complete ShowExampleMenuFile which we use in various places of this demo
        if (ImGui::Button("With a menu.."))
            ImGui::OpenPopup("my_file_popup");
        if (ImGui::BeginPopup("my_file_popup", ImGuiWindowFlags_MenuBar))
        {
            if (ImGui::BeginMenuBar())
            {
                if (ImGui::BeginMenu("File"))
                {
                    ShowExampleMenuFile();
                    ImGui::EndMenu();
                }
                if (ImGui::BeginMenu("Edit"))
                {
                    ImGui::MenuItem("Dummy");
                    ImGui::EndMenu();
                }
                ImGui::EndMenuBar();
            }
            ImGui::Text("Hello from popup!");
            ImGui::Button("This is a dummy button..");
            ImGui::EndPopup();
        }

        ImGui::TreePop();
    }

    IMGUI_DEMO_MARKER("Popups/Context menus");
    if (ImGui::TreeNode("Context menus"))
    {
        HelpMarker("\"Context\" functions are simple helpers to associate a Popup to a given Item or Window identifier.");

        // BeginPopupContextItem() is a helper to provide common/simple popup behavior of essentially doing:
        //     if (id == 0)
        //         id = GetItemID(); // Use last item id
        //     if (IsItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
        //         OpenPopup(id);
        //     return BeginPopup(id);
        // For advanced advanced uses you may want to replicate and customize this code.
        // See more details in BeginPopupContextItem().

        // Example 1
        // When used after an item that has an ID (e.g. Button), we can skip providing an ID to BeginPopupContextItem(),
        // and BeginPopupContextItem() will use the last item ID as the popup ID.
        {
            const char* names[5] = { "Label1", "Label2", "Label3", "Label4", "Label5" };
            for (int n = 0; n < 5; n++)
            {
                ImGui::Selectable(names[n]);
                if (ImGui::BeginPopupContextItem()) // <-- use last item id as popup id
                {
                    ImGui::Text("This a popup for \"%s\"!", names[n]);
                    if (ImGui::Button("Close"))
                        ImGui::CloseCurrentPopup();
                    ImGui::EndPopup();
                }
                if (ImGui::IsItemHovered())
                    ImGui::SetTooltip("Right-click to open popup");
            }
        }

        // Example 2
        // Popup on a Text() element which doesn't have an identifier: we need to provide an identifier to BeginPopupContextItem().
        // Using an explicit identifier is also convenient if you want to activate the popups from different locations.
        {
            HelpMarker("Text() elements don't have stable identifiers so we need to provide one.");
            static float value = 0.5f;
            ImGui::Text("Value = %.3f <-- (1) right-click this text", value);
            if (ImGui::BeginPopupContextItem("my popup"))
            {
                if (ImGui::Selectable("Set to zero")) value = 0.0f;
                if (ImGui::Selectable("Set to PI")) value = 3.1415f;
                ImGui::SetNextItemWidth(-FLT_MIN);
                ImGui::DragFloat("##Value", &value, 0.1f, 0.0f, 0.0f);
                ImGui::EndPopup();
            }

            // We can also use OpenPopupOnItemClick() to toggle the visibility of a given popup.
            // Here we make it that right-clicking this other text element opens the same popup as above.
            // The popup itself will be submitted by the code above.
            ImGui::Text("(2) Or right-click this text");
            ImGui::OpenPopupOnItemClick("my popup", ImGuiPopupFlags_MouseButtonRight);

            // Back to square one: manually open the same popup.
            if (ImGui::Button("(3) Or click this button"))
                ImGui::OpenPopup("my popup");
        }

        // Example 3
        // When using BeginPopupContextItem() with an implicit identifier (NULL == use last item ID),
        // we need to make sure your item identifier is stable.
        // In this example we showcase altering the item label while preserving its identifier, using the ### operator (see FAQ).
        {
            HelpMarker("Showcase using a popup ID linked to item ID, with the item having a changing label + stable ID using the ### operator.");
            static char name[32] = "Label1";
            char buf[64];
            sprintf(buf, "Button: %s###Button", name); // ### operator override ID ignoring the preceding label
            ImGui::Button(buf);
            if (ImGui::BeginPopupContextItem())
            {
                ImGui::Text("Edit name:");
                ImGui::InputText("##edit", name, IM_ARRAYSIZE(name));
                if (ImGui::Button("Close"))
                    ImGui::CloseCurrentPopup();
                ImGui::EndPopup();
            }
            ImGui::SameLine(); ImGui::Text("(<-- right-click here)");
        }

        ImGui::TreePop();
    }

    IMGUI_DEMO_MARKER("Popups/Modals");
    if (ImGui::TreeNode("Modals"))
    {
        ImGui::TextWrapped("Modal windows are like popups but the user cannot close them by clicking outside.");

        if (ImGui::Button("Delete.."))
            ImGui::OpenPopup("Delete?");

        // Always center this window when appearing
        ImVec2 center = ImGui::GetMainViewport()->GetCenter();
        ImGui::SetNextWindowPos(center, ImGuiCond_Appearing, ImVec2(0.5f, 0.5f));

        if (ImGui::BeginPopupModal("Delete?", NULL, ImGuiWindowFlags_AlwaysAutoResize))
        {
            ImGui::Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
            ImGui::Separator();

            //static int unused_i = 0;
            //ImGui::Combo("Combo", &unused_i, "Delete\0Delete harder\0");

            static bool dont_ask_me_next_time = false;
            ImGui::PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2(0, 0));
            ImGui::Checkbox("Don't ask me next time", &dont_ask_me_next_time);
            ImGui::PopStyleVar();

            if (ImGui::Button("OK", ImVec2(120, 0))) { ImGui::CloseCurrentPopup(); }
            ImGui::SetItemDefaultFocus();
            ImGui::SameLine();
            if (ImGui::Button("Cancel", ImVec2(120, 0))) { ImGui::CloseCurrentPopup(); }
            ImGui::EndPopup();
        }

        if (ImGui::Button("Stacked modals.."))
            ImGui::OpenPopup("Stacked 1");
        if (ImGui::BeginPopupModal("Stacked 1", NULL, ImGuiWindowFlags_MenuBar))
        {
            if (ImGui::BeginMenuBar())
            {
                if (ImGui::BeginMenu("File"))
                {
                    if (ImGui::MenuItem("Some menu item")) {}
                    ImGui::EndMenu();
                }
                ImGui::EndMenuBar();
            }
            ImGui::Text("Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it.");

            // Testing behavior of widgets stacking their own regular popups over the modal.
            static int item = 1;
            static float color[4] = { 0.4f, 0.7f, 0.0f, 0.5f };
            ImGui::Combo("Combo", &item, "aaaa\0bbbb\0cccc\0dddd\0eeee\0\0");
            ImGui::ColorEdit4("color", color);

            if (ImGui::Button("Add another modal.."))
                ImGui::OpenPopup("Stacked 2");

            // Also demonstrate passing a bool* to BeginPopupModal(), this will create a regular close button which
            // will close the popup. Note that the visibility state of popups is owned by imgui, so the input value
            // of the bool actually doesn't matter here.
            bool unused_open = true;
            if (ImGui::BeginPopupModal("Stacked 2", &unused_open))
            {
                ImGui::Text("Hello from Stacked The Second!");
                if (ImGui::Button("Close"))
                    ImGui::CloseCurrentPopup();
                ImGui::EndPopup();
            }

            if (ImGui::Button("Close"))
                ImGui::CloseCurrentPopup();
            ImGui::EndPopup();
        }

        ImGui::TreePop();
    }

    IMGUI_DEMO_MARKER("Popups/Menus inside a regular window");
    if (ImGui::TreeNode("Menus inside a regular window"))
    {
        ImGui::TextWrapped("Below we are testing adding menu items to a regular window. It's rather unusual but should work!");
        ImGui::Separator();

        ImGui::MenuItem("Menu item", "CTRL+M");
        if (ImGui::BeginMenu("Menu inside a regular window"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        ImGui::Separator();
        ImGui::TreePop();
    }
}